

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake.c
# Opt level: O3

decaf_error_t decaf_sha3_update(decaf_keccak_sponge_s *decaf_sponge,uint8_t *in,size_t len)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  bVar2 = decaf_sponge->params[0].position;
  bVar1 = decaf_sponge->params[0].rate;
  if (bVar1 <= bVar2) {
    __assert_fail("decaf_sponge->params->position < decaf_sponge->params->rate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/potatosalad[P]ed448goldilocks/src/shake.c"
                  ,0x5d,
                  "decaf_error_t decaf_sha3_update(struct decaf_keccak_sponge_s *restrict, const uint8_t *, size_t)"
                 );
  }
  if (199 < bVar1) {
    __assert_fail("decaf_sponge->params->rate < sizeof(decaf_sponge->state)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/potatosalad[P]ed448goldilocks/src/shake.c"
                  ,0x5e,
                  "decaf_error_t decaf_sha3_update(struct decaf_keccak_sponge_s *restrict, const uint8_t *, size_t)"
                 );
  }
  if (decaf_sponge->params[0].flags != 'A') {
    __assert_fail("decaf_sponge->params->flags == FLAG_ABSORBING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/potatosalad[P]ed448goldilocks/src/shake.c"
                  ,0x5f,
                  "decaf_error_t decaf_sha3_update(struct decaf_keccak_sponge_s *restrict, const uint8_t *, size_t)"
                 );
  }
  if (len != 0) {
    do {
      bVar1 = decaf_sponge->params[0].rate;
      uVar3 = (ulong)bVar2;
      uVar5 = bVar1 - uVar3;
      if (len < uVar5) {
        uVar5 = 0;
        do {
          decaf_sponge->state[0].b[uVar5 + uVar3] =
               decaf_sponge->state[0].b[uVar5 + uVar3] ^ in[uVar5];
          uVar5 = uVar5 + 1;
        } while (len != uVar5);
        decaf_sponge->params[0].position = decaf_sponge->params[0].position + (char)len;
        break;
      }
      if (bVar1 != bVar2) {
        uVar4 = 0;
        do {
          decaf_sponge->state[0].b[uVar4 + uVar3] =
               decaf_sponge->state[0].b[uVar4 + uVar3] ^ in[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
      }
      keccakf(decaf_sponge->state,decaf_sponge->params[0].start_round);
      decaf_sponge->params[0].position = '\0';
      in = in + uVar5;
      bVar2 = 0;
      len = len - uVar5;
    } while (len != 0);
  }
  return -(uint)(decaf_sponge->params[0].flags == 'A');
}

Assistant:

decaf_error_t decaf_sha3_update (
    struct decaf_keccak_sponge_s * __restrict__ decaf_sponge,
    const uint8_t *in,
    size_t len
) {
    assert(decaf_sponge->params->position < decaf_sponge->params->rate);
    assert(decaf_sponge->params->rate < sizeof(decaf_sponge->state));
    assert(decaf_sponge->params->flags == FLAG_ABSORBING);
    while (len) {
        size_t cando = decaf_sponge->params->rate - decaf_sponge->params->position, i;
        uint8_t* state = &decaf_sponge->state->b[decaf_sponge->params->position];
        if (cando > len) {
            for (i = 0; i < len; i += 1) state[i] ^= in[i];
            decaf_sponge->params->position += (uint8_t)len;
            break;
        } else {
            for (i = 0; i < cando; i += 1) state[i] ^= in[i];
            dokeccak(decaf_sponge);
            len -= cando;
            in += cando;
        }
    }
    return (decaf_sponge->params->flags == FLAG_ABSORBING) ? DECAF_SUCCESS : DECAF_FAILURE;
}